

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-handshake.c
# Opt level: O3

lws * lws_client_reset(lws **pwsi,int ssl,char *address,int port,char *path,char *host,char weak)

{
  undefined1 *puVar1;
  byte bVar2;
  _lws_websocket_related *p_Var3;
  _func_int_lws_ptr_lws_close_status *p_Var4;
  _func_void_lws_ptr *p_Var5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  char *s;
  char *pcVar10;
  lws *plVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  char *__s;
  char *pcVar15;
  uint local_6c;
  
  if (pwsi != (lws **)0x0) {
    plVar11 = *pwsi;
    _lws_log(0x10,"%s: wsi %p: redir %d: %s\n","lws_client_reset",plVar11,
             (ulong)(uint)(int)plVar11->redirects,address);
    if (plVar11->redirects == '\x03') {
      _lws_log(1,"%s: Too many redirects\n","lws_client_reset");
    }
    else {
      plVar11->redirects = plVar11->redirects + '\x01';
      lVar13 = 0;
      lVar14 = 0;
      do {
        iVar6 = lws_hdr_total_length(plVar11,(uint)"[W\\]^"[lVar13]);
        lVar14 = lVar14 + iVar6 + 1;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 5);
      iVar6 = lws_hdr_total_length(plVar11,_WSI_TOKEN_CLIENT_URI);
      if ((int)lVar14 <= iVar6) {
        iVar6 = lws_hdr_total_length(plVar11,_WSI_TOKEN_CLIENT_URI);
        lVar14 = (long)(iVar6 + 1);
      }
      sVar7 = strlen(path);
      sVar8 = strlen(address);
      sVar9 = strlen(host);
      lVar13 = sVar9 + sVar8 + sVar7 + lVar14;
      s = (char *)lws_realloc((void *)0x0,lVar13 + 4,"lws_client_reset");
      if (s != (char *)0x0) {
        lVar14 = 0;
        pcVar15 = s;
        do {
          bVar2 = "[W\\]^"[lVar14];
          iVar6 = lws_hdr_total_length(plVar11,(uint)bVar2);
          if (iVar6 == 0) {
            *pcVar15 = '\0';
          }
          else {
            pcVar10 = lws_hdr_simple_ptr(plVar11,(uint)bVar2);
            iVar6 = lws_hdr_total_length(plVar11,(uint)bVar2);
            memcpy(pcVar15,pcVar10,(long)(iVar6 + 1));
            iVar6 = lws_hdr_total_length(plVar11,(uint)bVar2);
            pcVar15 = pcVar15 + iVar6;
          }
          pcVar15 = pcVar15 + 1;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 5);
        sVar7 = strlen(address);
        memcpy(pcVar15,address,sVar7 + 1);
        sVar7 = strlen(pcVar15);
        pcVar10 = pcVar15 + sVar7 + 1;
        sVar8 = strlen(host);
        memcpy(pcVar10,host,sVar8 + 1);
        sVar8 = strlen(pcVar10);
        __s = pcVar15 + sVar8 + sVar7 + 2;
        sVar7 = strlen(path);
        memcpy(__s,path,sVar7 + 1);
        uVar12 = (ulong)(uint)port;
        local_6c = ssl;
        if (port == 0) {
          _lws_log(8,"%s: forcing port 443\n","lws_client_reset");
          local_6c = 1;
          uVar12 = 0x1bb;
        }
        _lws_log(8,"redirect ads=\'%s\', port=%d, path=\'%s\', ssl = %d, pifds %d\n",pcVar15,uVar12,
                 __s,(ulong)local_6c,plVar11->position_in_fds_table);
        __remove_wsi_socket_from_fds(plVar11);
        if (weak == '\0') {
          __lws_reset_wsi(plVar11);
        }
        else {
          p_Var3 = plVar11->ws;
          plVar11->ws = (_lws_websocket_related *)0x0;
          __lws_reset_wsi(plVar11);
          plVar11->ws = p_Var3;
        }
        plVar11->field_0x2e2 = plVar11->field_0x2e2 | 0x20;
        lws_ssl_close(plVar11);
        if ((plVar11->role_ops != (lws_role_ops *)0x0) &&
           (p_Var4 = plVar11->role_ops->close_kill_connection,
           p_Var4 != (_func_int_lws_ptr_lws_close_status *)0x0)) {
          (*p_Var4)(plVar11,1);
        }
        p_Var5 = plVar11->context->event_loop_ops->close_handle_manually;
        if (p_Var5 == (_func_void_lws_ptr *)0x0) {
          if ((plVar11->desc).sockfd != -1) {
            close((plVar11->desc).sockfd);
          }
        }
        else {
          (*p_Var5)(plVar11);
        }
        (plVar11->tls).use_ssl = (uint)(local_6c != 0) | (plVar11->tls).use_ssl & 0xfffffffe;
        if (((plVar11->protocol != (lws_protocols *)0x0) &&
            (plVar11->role_ops != (lws_role_ops *)0x0)) && ((plVar11->field_0x2e0 & 4) != 0)) {
          (*plVar11->protocol->callback)
                    (plVar11,(lws_callback_reasons)
                             *(undefined2 *)
                              ((long)plVar11->role_ops->protocol_unbind_cb +
                              (ulong)(plVar11->wsistate >> 0x1c & 2)),plVar11->user_space,
                     "lws_client_reset",0);
          plVar11->field_0x2e0 = plVar11->field_0x2e0 & 0xfb;
        }
        (plVar11->desc).sockfd = -1;
        lws_role_transition(plVar11,0x10000000,LRS_UNCONNECTED,&role_ops_h1);
        if (plVar11->protocol != (lws_protocols *)0x0) {
          lws_bind_protocol(plVar11,plVar11->protocol,"client_reset");
        }
        plVar11->pending_timeout = '\0';
        plVar11->c_port = (uint16_t)uVar12;
        plVar11->field_0x2dc = plVar11->field_0x2dc & 0xfe;
        iVar6 = lws_header_table_attach(plVar11,0);
        if (iVar6 == 0) {
          iVar6 = lws_hdr_simple_create(plVar11,_WSI_TOKEN_CLIENT_PEER_ADDRESS,pcVar15);
          if ((iVar6 == 0) &&
             (iVar6 = lws_hdr_simple_create(plVar11,_WSI_TOKEN_CLIENT_HOST,pcVar10), iVar6 == 0)) {
            lVar14 = 0;
            pcVar15 = s;
            do {
              bVar2 = "[W\\]^"[lVar14];
              iVar6 = lws_hdr_simple_create(plVar11,(uint)bVar2,pcVar15);
              if (iVar6 != 0) goto LAB_00126dd4;
              iVar6 = lws_hdr_total_length(plVar11,(uint)bVar2);
              pcVar15 = pcVar15 + (long)iVar6 + 1;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 5);
            *s = '/';
            uVar12 = lVar13 + 3;
            sVar7 = strlen(__s);
            if (sVar7 + 1 <= uVar12) {
              uVar12 = sVar7 + 1;
            }
            memmove(s + 1,__s,uVar12);
            iVar6 = lws_hdr_simple_create(plVar11,_WSI_TOKEN_CLIENT_URI,s);
            if (iVar6 == 0) {
              lws_realloc(s,0,"free");
              if ((plVar11->field_0x2e2 & 0x80) != 0) {
                puVar1 = &(plVar11->h2).field_0x11;
                *puVar1 = *puVar1 & 0xfc;
              }
              plVar11 = lws_client_connect_2_dnsreq(plVar11);
              *pwsi = plVar11;
              return plVar11;
            }
          }
        }
        else {
          _lws_log(1,"%s: failed to get ah\n","lws_client_reset");
        }
LAB_00126dd4:
        lws_realloc(s,0,"free");
      }
    }
  }
  return (lws *)0x0;
}

Assistant:

struct lws *
lws_client_reset(struct lws **pwsi, int ssl, const char *address, int port,
		 const char *path, const char *host, char weak)
{
#if defined(LWS_ROLE_WS)
	struct _lws_websocket_related *ws;
#endif
	char *stash, *p;
	struct lws *wsi;
	size_t size = 0;
	int n;

	if (!pwsi)
		return NULL;

	wsi = *pwsi;

	lwsl_debug("%s: wsi %p: redir %d: %s\n", __func__, wsi, wsi->redirects,
			address);

	if (wsi->redirects == 3) {
		lwsl_err("%s: Too many redirects\n", __func__);
		return NULL;
	}
	wsi->redirects++;

	/*
	 * goal is to close our role part, close the sockfd, detach the ah
	 * but leave our wsi extant and still bound to whatever vhost it was
	 */

	for (n = 0; n < (int)LWS_ARRAY_SIZE(hnames2); n++)
		size += lws_hdr_total_length(wsi, hnames2[n]) + 1;

	if ((int)size < lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_URI) + 1)
		size = lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_URI) + 1;

	/*
	 * The incoming address and host can be from inside the existing ah
	 * we are going to detach and reattch
	 */

	size += strlen(path) + 1 + strlen(address) + 1 + strlen(host) + 1 + 1;

	p = stash = lws_malloc(size, __func__);
	if (!stash)
		return NULL;

	/*
	 * _WSI_TOKEN_CLIENT_ORIGIN,
	 * _WSI_TOKEN_CLIENT_SENT_PROTOCOLS,
	 * _WSI_TOKEN_CLIENT_METHOD,
	 * _WSI_TOKEN_CLIENT_IFACE,
	 * _WSI_TOKEN_CLIENT_ALPN
	 * address
	 * host
	 * path
	 */

	for (n = 0; n < (int)LWS_ARRAY_SIZE(hnames2); n++)
		if (lws_hdr_total_length(wsi, hnames2[n])) {
			memcpy(p, lws_hdr_simple_ptr(wsi, hnames2[n]),
				lws_hdr_total_length(wsi, hnames2[n]) + 1);
			p += lws_hdr_total_length(wsi, hnames2[n]) + 1;
		} else
			*p++ = '\0';

	memcpy(p, address, strlen(address) + 1);
	address = p;
	p += strlen(address) + 1;
	memcpy(p, host, strlen(host) + 1);
	host = p;
	p += strlen(host) + 1;
	memcpy(p, path, strlen(path) + 1);
	path = p;

	if (!port) {
		lwsl_info("%s: forcing port 443\n", __func__);

		port = 443;
		ssl = 1;
	}

	lwsl_info("redirect ads='%s', port=%d, path='%s', ssl = %d, pifds %d\n",
		   address, port, path, ssl, wsi->position_in_fds_table);

	__remove_wsi_socket_from_fds(wsi);
#if defined(LWS_ROLE_WS)
	if (weak) {
		ws = wsi->ws;
		wsi->ws = NULL;
	}
#endif
	__lws_reset_wsi(wsi); /* detaches ah here */
#if defined(LWS_ROLE_WS)
	if (weak)
		wsi->ws = ws;
#endif
	wsi->client_pipeline = 1;

	/* close the connection by hand */

#if defined(LWS_WITH_TLS)
	lws_ssl_close(wsi);
#endif

	if (wsi->role_ops && wsi->role_ops->close_kill_connection)
		wsi->role_ops->close_kill_connection(wsi, 1);

	if (wsi->context->event_loop_ops->close_handle_manually)
		wsi->context->event_loop_ops->close_handle_manually(wsi);
	else
		if (wsi->desc.sockfd != LWS_SOCK_INVALID)
			compatible_close(wsi->desc.sockfd);

#if defined(LWS_WITH_TLS)
	if (!ssl)
		wsi->tls.use_ssl &= ~LCCSCF_USE_SSL;
	else
		wsi->tls.use_ssl |= LCCSCF_USE_SSL;
#else
	if (ssl) {
		lwsl_err("%s: not configured for ssl\n", __func__);
		goto bail;
	}
#endif

	if (wsi->protocol && wsi->role_ops && wsi->protocol_bind_balance) {
		wsi->protocol->callback(wsi,
				wsi->role_ops->protocol_unbind_cb[
				       !!lwsi_role_server(wsi)],
				       wsi->user_space, (void *)__func__, 0);

		wsi->protocol_bind_balance = 0;
	}

	wsi->desc.sockfd = LWS_SOCK_INVALID;
	lws_role_transition(wsi, LWSIFR_CLIENT, LRS_UNCONNECTED, &role_ops_h1);
//	wsi->protocol = NULL;
	if (wsi->protocol)
		lws_bind_protocol(wsi, wsi->protocol, "client_reset");
	wsi->pending_timeout = NO_PENDING_TIMEOUT;
	wsi->c_port = port;
	wsi->hdr_parsing_completed = 0;

	if (lws_header_table_attach(wsi, 0)) {
		lwsl_err("%s: failed to get ah\n", __func__);
		goto bail;
	}
	//_lws_header_table_reset(wsi->http.ah);

	if (lws_hdr_simple_create(wsi, _WSI_TOKEN_CLIENT_PEER_ADDRESS, address))
		goto bail;

	if (lws_hdr_simple_create(wsi, _WSI_TOKEN_CLIENT_HOST, host))
		goto bail;

	/*
	 * _WSI_TOKEN_CLIENT_ORIGIN,
	 * _WSI_TOKEN_CLIENT_SENT_PROTOCOLS,
	 * _WSI_TOKEN_CLIENT_METHOD,
	 * _WSI_TOKEN_CLIENT_IFACE,
	 * _WSI_TOKEN_CLIENT_ALPN
	 * address
	 * host
	 * path
	 */

	p = stash;
	for (n = 0; n < (int)LWS_ARRAY_SIZE(hnames2); n++) {
		if (lws_hdr_simple_create(wsi, hnames2[n], p))
			goto bail;
		p += lws_hdr_total_length(wsi, hnames2[n]) + 1;
	}

	stash[0] = '/';
	memmove(&stash[1], path, size - 1 < strlen(path) + 1 ? size - 1 : strlen(path) + 1);
	if (lws_hdr_simple_create(wsi, _WSI_TOKEN_CLIENT_URI, stash))
		goto bail;

	lws_free_set_NULL(stash);

#if defined(LWS_WITH_HTTP2)
	if (wsi->client_mux_substream)
		wsi->h2.END_STREAM = wsi->h2.END_HEADERS = 0;
#endif

	*pwsi = lws_client_connect_2_dnsreq(wsi);

	return *pwsi;

bail:
	lws_free_set_NULL(stash);

	return NULL;
}